

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::GeometryShaderMaxUniformComponentsTest
          (GeometryShaderMaxUniformComponentsTest *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  TestCaseBase::TestCaseBase((TestCaseBase *)this,context,extParams,name,description);
  *(undefined8 *)
   ((long)&(this->super_GeometryShaderLimitsTransformFeedbackBase).m_vertex_shader_parts + 4) = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_n_geometry_shader_parts = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_n_vertex_shader_parts = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_geometry_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_vertex_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_buffer_object_id = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_vertex_array_object_id = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_fragment_shader_parts = (GLchar **)0x0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_fragment_shader_id = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_geometry_shader_id = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_program_object_id = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_vertex_shader_id = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_captured_varyings_names = (GLchar **)0x0
  ;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_n_captured_varyings = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).m_buffer_size = 0;
  (this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderMaxUniformComponentsTest_02105750;
  (this->m_max_uniform_vectors_string)._M_dataplus._M_p =
       (pointer)&(this->m_max_uniform_vectors_string).field_2;
  (this->m_max_uniform_vectors_string)._M_string_length = 0;
  (this->m_max_uniform_vectors_string).field_2._M_local_buf[0] = '\0';
  this->m_max_uniform_components = 0;
  this->m_max_uniform_vectors = 0;
  this->m_uniform_location = 0;
  (this->m_uniform_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniform_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_uniform_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

GeometryShaderMaxUniformComponentsTest::GeometryShaderMaxUniformComponentsTest(Context&				context,
																			   const ExtParameters& extParams,
																			   const char*			name,
																			   const char*			description)
	: GeometryShaderLimitsTransformFeedbackBase(context, extParams, name, description)
	, m_max_uniform_components(0)
	, m_max_uniform_vectors(0)
	, m_uniform_location(0)
{
	/* Nothing to be done here */
}